

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::TransitionRenderTargets
          (DeviceContextVkImpl *this,RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  TEXTURE_VIEW_TYPE TVar1;
  ITextureView *pIVar2;
  element_type *peVar3;
  int iVar4;
  VkBool32 VVar5;
  TextureViewVkImpl *pTVar6;
  undefined4 extraout_var;
  uint uVar8;
  ulong in_RCX;
  undefined7 in_register_00000031;
  VkImageLayout ExpectedLayout;
  ulong uVar9;
  undefined8 unaff_R15;
  string msg;
  string local_48;
  TextureVkImpl *pTVar7;
  
  if (((int)CONCAT71(in_register_00000031,StateTransitionMode) == 1) &&
     ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0)) {
    FormatString<char[56]>
              (&local_48,(char (*) [56])"State transitions are not allowed inside a render pass.");
    in_RCX = 0x6fb;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"TransitionRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x6fb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  pTVar6 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
  if (pTVar6 != (TextureViewVkImpl *)0x0) {
    TVar1 = (pTVar6->super_TextureViewBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
            .m_Desc.ViewType;
    uVar8 = (int)CONCAT71((int7)((ulong)unaff_R15 >> 8),TVar1) - 3;
    if (1 < (byte)uVar8) {
      FormatString<char[26],char[91]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL"
                 ,(char (*) [91])(ulong)uVar8);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"TransitionRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x700);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      pTVar6 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
    }
    uVar8 = (uint)(TVar1 == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
    pTVar7 = (TextureVkImpl *)
             (pTVar6->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture;
    if (pTVar7 != (TextureVkImpl *)0x0) {
      CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>((ITexture *)pTVar7);
    }
    in_RCX = 0;
    TransitionOrVerifyTextureState
              (this,pTVar7,StateTransitionMode,uVar8 * 0x40 + RESOURCE_STATE_DEPTH_WRITE,
               uVar8 + VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
               "Binding depth-stencil buffer (DeviceContextVkImpl::TransitionRenderTargets)");
  }
  uVar8 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
  if (uVar8 != 0) {
    uVar9 = 0;
    do {
      pTVar6 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundRenderTargets[uVar9].
               m_pObject;
      if (pTVar6 != (TextureViewVkImpl *)0x0) {
        pTVar7 = (TextureVkImpl *)
                 (pTVar6->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture;
        if (pTVar7 != (TextureVkImpl *)0x0) {
          CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>((ITexture *)pTVar7);
        }
        TransitionOrVerifyTextureState
                  (this,pTVar7,StateTransitionMode,RESOURCE_STATE_RENDER_TARGET,
                   VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
                   "Binding render targets (DeviceContextVkImpl::TransitionRenderTargets)");
        uVar8 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
      }
      uVar9 = uVar9 + 1;
      in_RCX = (ulong)uVar8;
    } while (uVar9 < in_RCX);
  }
  pIVar2 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap.m_pObject;
  if (pIVar2 != (ITextureView *)0x0) {
    peVar3 = (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
             m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar4 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[10])();
    pTVar7 = (TextureVkImpl *)CONCAT44(extraout_var,iVar4);
    if (pTVar7 != (TextureVkImpl *)0x0) {
      CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>((ITexture *)pTVar7);
    }
    VVar5 = (peVar3->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate;
    if (((peVar3->m_EnabledExtFeatures).FragmentDensityMap.fragmentDensityMap != 0) == (VVar5 != 0))
    {
      FormatString<char[26],char[134]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "(ExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE) ^ (ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE)"
                 ,(char (*) [134])CONCAT71((int7)(in_RCX >> 8),VVar5 != 0));
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"TransitionRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x71e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      VVar5 = (peVar3->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate;
    }
    ExpectedLayout = VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR;
    if (VVar5 == 0) {
      ExpectedLayout = VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT;
    }
    TransitionOrVerifyTextureState
              (this,pTVar7,StateTransitionMode,RESOURCE_STATE_MAX_BIT,ExpectedLayout,
               "Binding shading rate map (DeviceContextVkImpl::TransitionRenderTargets)");
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionRenderTargets(RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    VERIFY(StateTransitionMode != RESOURCE_STATE_TRANSITION_MODE_TRANSITION || m_pActiveRenderPass == nullptr,
           "State transitions are not allowed inside a render pass.");

    if (m_pBoundDepthStencil)
    {
        const TEXTURE_VIEW_TYPE ViewType = m_pBoundDepthStencil->GetDesc().ViewType;
        VERIFY_EXPR(ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
        const bool bReadOnly = ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;

        const RESOURCE_STATE NewState = bReadOnly ?
            RESOURCE_STATE_DEPTH_READ :
            RESOURCE_STATE_DEPTH_WRITE;

        const VkImageLayout ExpectedLayout = bReadOnly ?
            VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL :
            VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;

        TextureVkImpl* pDepthBufferVk = m_pBoundDepthStencil->GetTexture<TextureVkImpl>();
        TransitionOrVerifyTextureState(*pDepthBufferVk, StateTransitionMode, NewState, ExpectedLayout,
                                       "Binding depth-stencil buffer (DeviceContextVkImpl::TransitionRenderTargets)");
    }

    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        if (TextureViewImplType* pRTVVk = m_pBoundRenderTargets[rt])
        {
            TextureVkImpl* pRenderTargetVk = pRTVVk->GetTexture<TextureVkImpl>();
            TransitionOrVerifyTextureState(*pRenderTargetVk, StateTransitionMode, RESOURCE_STATE_RENDER_TARGET, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
                                           "Binding render targets (DeviceContextVkImpl::TransitionRenderTargets)");
        }
    }

    if (m_pBoundShadingRateMap)
    {
        const VulkanUtilities::VulkanLogicalDevice::ExtensionFeatures& ExtFeatures       = m_pDevice->GetLogicalDevice().GetEnabledExtFeatures();
        TextureVkImpl*                                                 pShadingRateMapVk = ClassPtrCast<TextureVkImpl>(m_pBoundShadingRateMap->GetTexture());
        VERIFY_EXPR((ExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE) ^ (ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE));
        const VkImageLayout vkRequiredLayout = ExtFeatures.ShadingRate.attachmentFragmentShadingRate ?
            VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR :
            VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT;
        TransitionOrVerifyTextureState(*pShadingRateMapVk, StateTransitionMode, RESOURCE_STATE_SHADING_RATE, vkRequiredLayout,
                                       "Binding shading rate map (DeviceContextVkImpl::TransitionRenderTargets)");
    }
}